

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_dictionary.cc
# Opt level: O3

TemplateDictionary * __thiscall
ctemplate::TemplateDictionary::InternalMakeCopy
          (TemplateDictionary *this,TemplateString *name_of_copy,UnsafeArena *arena,
          TemplateDictionary *parent_dict,TemplateDictionary *template_global_dict_owner)

{
  UnsafeArena *pUVar1;
  small_map<std::map<unsigned_long,_ctemplate::TemplateString,_std::less<unsigned_long>,_ctemplate::ArenaAllocator<std::pair<const_unsigned_long,_ctemplate::TemplateString>,_ctemplate::UnsafeArena>_>,_4,_std::equal_to<unsigned_long>,_ctemplate::TemplateDictionary::map_arena_init>
  *this_00;
  char *pcVar2;
  iterator iVar3;
  TemplateDictionary *this_01;
  VariableDict *pVVar4;
  TemplateDictionary *pTVar5;
  SectionDict *pSVar6;
  IncludeDict *pIVar7;
  vector<ctemplate::TemplateDictionary*,ctemplate::ArenaAllocator<ctemplate::TemplateDictionary*,ctemplate::UnsafeArena>>
  *pvVar8;
  _Base_ptr p_Var9;
  _Rb_tree_node_base *p_Var10;
  uint uVar11;
  _Rb_tree_node_base *p_Var12;
  _Rb_tree_node_base *p_Var13;
  _Base_ptr p_Var14;
  TemplateString local_a0;
  _Rb_tree_node_base *local_80;
  _Rb_tree_node_base *local_78;
  value_type local_70;
  pair<ctemplate::small_map<std::map<unsigned_long,_ctemplate::TemplateString,_std::less<unsigned_long>,_ctemplate::ArenaAllocator<std::pair<const_unsigned_long,_ctemplate::TemplateString>,_ctemplate::UnsafeArena>_>,_4,_std::equal_to<unsigned_long>,_ctemplate::TemplateDictionary::map_arena_init>::iterator,_bool>
  local_48;
  
  if (this->template_global_dict_owner_ == this) {
    this_01 = (TemplateDictionary *)operator_new(0x70);
    TemplateDictionary(this_01,name_of_copy,arena);
  }
  else {
    if (arena == (UnsafeArena *)0x0) {
      __assert_fail("arena",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/template_dictionary.cc"
                    ,0x11f,
                    "TemplateDictionary *ctemplate::TemplateDictionary::InternalMakeCopy(const TemplateString &, UnsafeArena *, TemplateDictionary *, TemplateDictionary *)"
                   );
    }
    if (parent_dict == (TemplateDictionary *)0x0) {
      this_01 = (TemplateDictionary *)BaseArena::GetMemory(&arena->super_BaseArena,0x70,8);
      parent_dict = (TemplateDictionary *)0x0;
    }
    else {
      if (parent_dict->arena_ != arena) {
        __assert_fail("parent_dict ? arena == parent_dict->arena_ : true",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/template_dictionary.cc"
                      ,0x120,
                      "TemplateDictionary *ctemplate::TemplateDictionary::InternalMakeCopy(const TemplateString &, UnsafeArena *, TemplateDictionary *, TemplateDictionary *)"
                     );
      }
      this_01 = (TemplateDictionary *)BaseArena::GetMemory(&arena->super_BaseArena,0x70,8);
    }
    TemplateDictionary(this_01,name_of_copy,arena,parent_dict,template_global_dict_owner);
  }
  pVVar4 = this->variable_dict_;
  if (pVVar4 != (VariableDict *)0x0) {
    if (this_01->variable_dict_ == (VariableDict *)0x0) {
      pVVar4 = (VariableDict *)BaseArena::GetMemory(&this_01->arena_->super_BaseArena,0xb0,8);
      pUVar1 = this_01->arena_;
      pVVar4->size_ = 0;
      (pVVar4->functor_).arena_ = pUVar1;
      this_01->variable_dict_ = pVVar4;
      pVVar4 = this->variable_dict_;
    }
    uVar11 = pVVar4->size_;
    p_Var10 = (_Rb_tree_node_base *)0x0;
    if ((int)uVar11 < 0) {
      p_Var10 = *(_Rb_tree_node_base **)((long)&pVVar4->field_2 + 0x20);
      p_Var13 = (_Rb_tree_node_base *)0x0;
    }
    else {
      p_Var13 = (_Rb_tree_node_base *)&pVVar4->field_2;
    }
    do {
      if (p_Var13 == (_Rb_tree_node_base *)0x0) {
        if ((int)uVar11 < 0 && p_Var10 == (_Rb_tree_node_base *)((long)&pVVar4->field_2 + 0x10))
        break;
      }
      else {
        p_Var12 = (_Rb_tree_node_base *)0x0;
        if (-1 < (int)uVar11) {
          p_Var12 = (_Rb_tree_node_base *)((long)&pVVar4->field_2 + (ulong)uVar11 * 0x28);
        }
        if (p_Var13 == p_Var12) break;
      }
      this_00 = this_01->variable_dict_;
      p_Var12 = p_Var10 + 1;
      if (p_Var13 != (_Rb_tree_node_base *)0x0) {
        p_Var12 = p_Var13;
      }
      Memdup(&local_a0,this_01,(TemplateString *)&p_Var12->_M_parent);
      local_70.first = *(unsigned_long *)p_Var12;
      local_70.second._17_7_ = local_a0._17_7_;
      local_70.second.is_immutable_ = local_a0.is_immutable_;
      local_70.second.id_ = local_a0.id_;
      local_70.second.ptr_ = local_a0.ptr_;
      local_70.second.length_ = local_a0.length_;
      small_map<std::map<unsigned_long,_ctemplate::TemplateString,_std::less<unsigned_long>,_ctemplate::ArenaAllocator<std::pair<const_unsigned_long,_ctemplate::TemplateString>,_ctemplate::UnsafeArena>_>,_4,_std::equal_to<unsigned_long>,_ctemplate::TemplateDictionary::map_arena_init>
      ::insert(&local_48,this_00,&local_70);
      if (p_Var13 == (_Rb_tree_node_base *)0x0) {
        p_Var10 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var10);
        p_Var13 = (_Rb_tree_node_base *)0x0;
      }
      else {
        p_Var13 = (_Rb_tree_node_base *)&p_Var13[1]._M_parent;
      }
      pVVar4 = this->variable_dict_;
      uVar11 = pVVar4->size_;
    } while( true );
  }
  pTVar5 = this->template_global_dict_;
  if (pTVar5 != (TemplateDictionary *)0x0) {
    pcVar2 = (pTVar5->name_).ptr_;
    local_a0.ptr_ = &local_a0.is_immutable_;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_a0,pcVar2,pcVar2 + (pTVar5->name_).length_);
    local_70.first = (unsigned_long)local_a0.ptr_;
    local_70.second.ptr_ = (char *)local_a0.length_;
    local_70.second.length_ = local_70.second.length_ & 0xffffffffffffff00;
    local_70.second.is_immutable_ = false;
    local_70.second._17_7_ = 0;
    pTVar5 = InternalMakeCopy(pTVar5,(TemplateString *)&local_70,this_01->arena_,this_01,
                              this_01->template_global_dict_owner_);
    this_01->template_global_dict_ = pTVar5;
    if ((bool *)local_a0.ptr_ != &local_a0.is_immutable_) {
      operator_delete(local_a0.ptr_);
    }
  }
  pSVar6 = this->section_dict_;
  if (pSVar6 != (SectionDict *)0x0) {
    if (this_01->section_dict_ == (SectionDict *)0x0) {
      pSVar6 = (SectionDict *)BaseArena::GetMemory(&this_01->arena_->super_BaseArena,0x50,8);
      pUVar1 = this_01->arena_;
      pSVar6->size_ = 0;
      (pSVar6->functor_).arena_ = pUVar1;
      this_01->section_dict_ = pSVar6;
      pSVar6 = this->section_dict_;
    }
    uVar11 = pSVar6->size_;
    p_Var10 = (_Rb_tree_node_base *)0x0;
    if ((int)uVar11 < 0) {
      p_Var10 = *(_Rb_tree_node_base **)((long)&pSVar6->field_2 + 0x20);
      p_Var13 = (_Rb_tree_node_base *)0x0;
    }
    else {
      p_Var13 = (_Rb_tree_node_base *)&pSVar6->field_2;
    }
    do {
      if (p_Var13 == (_Rb_tree_node_base *)0x0) {
        if ((int)uVar11 < 0 && p_Var10 == (_Rb_tree_node_base *)((long)&pSVar6->field_2 + 0x10))
        break;
      }
      else {
        p_Var12 = (_Rb_tree_node_base *)0x0;
        if (-1 < (int)uVar11) {
          p_Var12 = (_Rb_tree_node_base *)((long)&pSVar6->field_2 + (ulong)uVar11 * 0x10);
        }
        if (p_Var13 == p_Var12) break;
      }
      pvVar8 = (vector<ctemplate::TemplateDictionary*,ctemplate::ArenaAllocator<ctemplate::TemplateDictionary*,ctemplate::UnsafeArena>>
                *)BaseArena::GetMemory(&this_01->arena_->super_BaseArena,0x20,8);
      *(UnsafeArena **)pvVar8 = this_01->arena_;
      *(undefined8 *)(pvVar8 + 8) = 0;
      *(undefined8 *)(pvVar8 + 0x10) = 0;
      *(undefined8 *)(pvVar8 + 0x18) = 0;
      p_Var12 = p_Var10 + 1;
      if (p_Var13 != (_Rb_tree_node_base *)0x0) {
        p_Var12 = p_Var13;
      }
      local_a0.ptr_ = *(char **)p_Var12;
      local_a0.length_ = (size_t)pvVar8;
      local_80 = p_Var10;
      local_78 = p_Var13;
      small_map<std::map<unsigned_long,_std::vector<ctemplate::TemplateDictionary_*,_ctemplate::ArenaAllocator<ctemplate::TemplateDictionary_*,_ctemplate::UnsafeArena>_>_*,_std::less<unsigned_long>,_ctemplate::ArenaAllocator<std::pair<const_unsigned_long,_std::vector<ctemplate::TemplateDictionary_*,_ctemplate::ArenaAllocator<ctemplate::TemplateDictionary_*,_ctemplate::UnsafeArena>_>_*>,_ctemplate::UnsafeArena>_>,_4,_std::equal_to<unsigned_long>,_ctemplate::TemplateDictionary::map_arena_init>
      ::insert((pair<ctemplate::small_map<std::map<unsigned_long,_std::vector<ctemplate::TemplateDictionary_*,_ctemplate::ArenaAllocator<ctemplate::TemplateDictionary_*,_ctemplate::UnsafeArena>_>_*,_std::less<unsigned_long>,_ctemplate::ArenaAllocator<std::pair<const_unsigned_long,_std::vector<ctemplate::TemplateDictionary_*,_ctemplate::ArenaAllocator<ctemplate::TemplateDictionary_*,_ctemplate::UnsafeArena>_>_*>,_ctemplate::UnsafeArena>_>,_4,_std::equal_to<unsigned_long>,_ctemplate::TemplateDictionary::map_arena_init>::iterator,_bool>
                *)&local_70,this_01->section_dict_,(value_type *)&local_a0);
      p_Var9 = p_Var12->_M_parent;
      for (p_Var14 = p_Var9->_M_parent; p_Var14 != p_Var9->_M_left;
          p_Var14 = (_Base_ptr)&p_Var14->_M_parent) {
        pTVar5 = *(TemplateDictionary **)p_Var14;
        pcVar2 = (pTVar5->name_).ptr_;
        local_a0.ptr_ = &local_a0.is_immutable_;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_a0,pcVar2,pcVar2 + (pTVar5->name_).length_);
        local_70.first = (unsigned_long)local_a0.ptr_;
        local_70.second.ptr_ = (char *)local_a0.length_;
        local_70.second.length_ = local_70.second.length_ & 0xffffffffffffff00;
        local_70.second.is_immutable_ = false;
        local_70.second._17_7_ = 0;
        local_48.first.array_iter_ =
             (ManualConstructor<std::pair<const_unsigned_long,_ctemplate::TemplateString>_> *)
             InternalMakeCopy(pTVar5,(TemplateString *)&local_70,this_01->arena_,this_01,
                              this_01->template_global_dict_owner_);
        iVar3._M_current = *(TemplateDictionary ***)(pvVar8 + 0x10);
        if (iVar3._M_current == *(TemplateDictionary ***)(pvVar8 + 0x18)) {
          std::
          vector<ctemplate::TemplateDictionary*,ctemplate::ArenaAllocator<ctemplate::TemplateDictionary*,ctemplate::UnsafeArena>>
          ::_M_realloc_insert<ctemplate::TemplateDictionary*>
                    (pvVar8,iVar3,(TemplateDictionary **)&local_48);
        }
        else {
          *iVar3._M_current = (TemplateDictionary *)local_48.first.array_iter_;
          *(long *)(pvVar8 + 0x10) = *(long *)(pvVar8 + 0x10) + 8;
        }
        if ((bool *)local_a0.ptr_ != &local_a0.is_immutable_) {
          operator_delete(local_a0.ptr_);
        }
        p_Var9 = p_Var12->_M_parent;
      }
      if (local_78 == (_Rb_tree_node_base *)0x0) {
        p_Var10 = (_Rb_tree_node_base *)std::_Rb_tree_increment(local_80);
        p_Var13 = (_Rb_tree_node_base *)0x0;
      }
      else {
        p_Var13 = (_Rb_tree_node_base *)&local_78->_M_left;
        p_Var10 = local_80;
      }
      pSVar6 = this->section_dict_;
      uVar11 = pSVar6->size_;
    } while( true );
  }
  pIVar7 = this->include_dict_;
  if (pIVar7 == (IncludeDict *)0x0) {
LAB_00123ea4:
    local_a0.ptr_ = "";
    if (this->filename_ != (char *)0x0) {
      local_a0.ptr_ = this->filename_;
    }
    local_a0.length_ = strlen(local_a0.ptr_);
    local_a0.is_immutable_ = false;
    local_a0.id_ = 0;
    Memdup((TemplateString *)&local_70,this_01,&local_a0);
    this_01->filename_ = (char *)local_70.first;
    return this_01;
  }
  if (this_01->include_dict_ == (IncludeDict *)0x0) {
    pIVar7 = (IncludeDict *)BaseArena::GetMemory(&this_01->arena_->super_BaseArena,0x50,8);
    pUVar1 = this_01->arena_;
    pIVar7->size_ = 0;
    (pIVar7->functor_).arena_ = pUVar1;
    this_01->include_dict_ = pIVar7;
    pIVar7 = this->include_dict_;
  }
  uVar11 = pIVar7->size_;
  p_Var10 = (_Rb_tree_node_base *)0x0;
  if ((int)uVar11 < 0) {
    p_Var10 = *(_Rb_tree_node_base **)((long)&pIVar7->field_2 + 0x20);
    p_Var13 = (_Rb_tree_node_base *)0x0;
  }
  else {
    p_Var13 = (_Rb_tree_node_base *)&pIVar7->field_2;
  }
  do {
    if (p_Var13 == (_Rb_tree_node_base *)0x0) {
      if ((int)uVar11 < 0 && p_Var10 == (_Rb_tree_node_base *)((long)&pIVar7->field_2 + 0x10))
      goto LAB_00123ea4;
    }
    else {
      p_Var12 = (_Rb_tree_node_base *)0x0;
      if (-1 < (int)uVar11) {
        p_Var12 = (_Rb_tree_node_base *)((long)&pIVar7->field_2 + (ulong)uVar11 * 0x10);
      }
      if (p_Var13 == p_Var12) goto LAB_00123ea4;
    }
    pvVar8 = (vector<ctemplate::TemplateDictionary*,ctemplate::ArenaAllocator<ctemplate::TemplateDictionary*,ctemplate::UnsafeArena>>
              *)BaseArena::GetMemory(&this_01->arena_->super_BaseArena,0x20,8);
    *(UnsafeArena **)pvVar8 = this_01->arena_;
    *(undefined8 *)(pvVar8 + 8) = 0;
    *(undefined8 *)(pvVar8 + 0x10) = 0;
    *(undefined8 *)(pvVar8 + 0x18) = 0;
    p_Var12 = p_Var10 + 1;
    if (p_Var13 != (_Rb_tree_node_base *)0x0) {
      p_Var12 = p_Var13;
    }
    local_a0.ptr_ = *(char **)p_Var12;
    local_a0.length_ = (size_t)pvVar8;
    local_80 = p_Var10;
    local_78 = p_Var13;
    small_map<std::map<unsigned_long,_std::vector<ctemplate::TemplateDictionary_*,_ctemplate::ArenaAllocator<ctemplate::TemplateDictionary_*,_ctemplate::UnsafeArena>_>_*,_std::less<unsigned_long>,_ctemplate::ArenaAllocator<std::pair<const_unsigned_long,_std::vector<ctemplate::TemplateDictionary_*,_ctemplate::ArenaAllocator<ctemplate::TemplateDictionary_*,_ctemplate::UnsafeArena>_>_*>,_ctemplate::UnsafeArena>_>,_4,_std::equal_to<unsigned_long>,_ctemplate::TemplateDictionary::map_arena_init>
    ::insert((pair<ctemplate::small_map<std::map<unsigned_long,_std::vector<ctemplate::TemplateDictionary_*,_ctemplate::ArenaAllocator<ctemplate::TemplateDictionary_*,_ctemplate::UnsafeArena>_>_*,_std::less<unsigned_long>,_ctemplate::ArenaAllocator<std::pair<const_unsigned_long,_std::vector<ctemplate::TemplateDictionary_*,_ctemplate::ArenaAllocator<ctemplate::TemplateDictionary_*,_ctemplate::UnsafeArena>_>_*>,_ctemplate::UnsafeArena>_>,_4,_std::equal_to<unsigned_long>,_ctemplate::TemplateDictionary::map_arena_init>::iterator,_bool>
              *)&local_70,this_01->include_dict_,(value_type *)&local_a0);
    p_Var9 = p_Var12->_M_parent;
    for (p_Var14 = p_Var9->_M_parent; p_Var14 != p_Var9->_M_left;
        p_Var14 = (_Base_ptr)&p_Var14->_M_parent) {
      pTVar5 = *(TemplateDictionary **)p_Var14;
      pcVar2 = (pTVar5->name_).ptr_;
      local_a0.ptr_ = &local_a0.is_immutable_;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_a0,pcVar2,pcVar2 + (pTVar5->name_).length_);
      local_70.first = (unsigned_long)local_a0.ptr_;
      local_70.second.ptr_ = (char *)local_a0.length_;
      local_70.second.length_ = local_70.second.length_ & 0xffffffffffffff00;
      local_70.second.is_immutable_ = false;
      local_70.second._17_7_ = 0;
      local_48.first.array_iter_ =
           (ManualConstructor<std::pair<const_unsigned_long,_ctemplate::TemplateString>_> *)
           InternalMakeCopy(pTVar5,(TemplateString *)&local_70,this_01->arena_,
                            (TemplateDictionary *)0x0,this_01->template_global_dict_owner_);
      iVar3._M_current = *(TemplateDictionary ***)(pvVar8 + 0x10);
      if (iVar3._M_current == *(TemplateDictionary ***)(pvVar8 + 0x18)) {
        std::
        vector<ctemplate::TemplateDictionary*,ctemplate::ArenaAllocator<ctemplate::TemplateDictionary*,ctemplate::UnsafeArena>>
        ::_M_realloc_insert<ctemplate::TemplateDictionary*>
                  (pvVar8,iVar3,(TemplateDictionary **)&local_48);
      }
      else {
        *iVar3._M_current = (TemplateDictionary *)local_48.first.array_iter_;
        *(long *)(pvVar8 + 0x10) = *(long *)(pvVar8 + 0x10) + 8;
      }
      if ((bool *)local_a0.ptr_ != &local_a0.is_immutable_) {
        operator_delete(local_a0.ptr_);
      }
      p_Var9 = p_Var12->_M_parent;
    }
    if (local_78 == (_Rb_tree_node_base *)0x0) {
      p_Var10 = (_Rb_tree_node_base *)std::_Rb_tree_increment(local_80);
      p_Var13 = (_Rb_tree_node_base *)0x0;
    }
    else {
      p_Var13 = (_Rb_tree_node_base *)&local_78->_M_left;
      p_Var10 = local_80;
    }
    pIVar7 = this->include_dict_;
    uVar11 = pIVar7->size_;
  } while( true );
}

Assistant:

TemplateDictionary* TemplateDictionary::InternalMakeCopy(
    const TemplateString& name_of_copy,
    UnsafeArena* arena,
    TemplateDictionary* parent_dict,
    TemplateDictionary* template_global_dict_owner) {

  TemplateDictionary* newdict;
  if (template_global_dict_owner_ == this) {
    // We're a root-level template.  We want the copy to be just like
    // us, and have its own template_global_dict_, that it owns.
    // We use the normal global new, since newdict will be returned
    // to the user.
    newdict = new TemplateDictionary(name_of_copy, arena);
  } else {                          // recursive calls use private contructor
    // We're not a root-level template, so we want the copy to refer to the
    // same template_global_dict_ owner that we do.
    // Note: we always use our own arena, even when we have a parent
    //       (though we have the same arena as our parent when we have one).
    assert(arena);
    assert(parent_dict ? arena == parent_dict->arena_ : true);
    newdict = CreateTemplateSubdict(name_of_copy, arena,
                                    parent_dict, template_global_dict_owner);
  }

  // Copy the variable dictionary
  if (variable_dict_) {
    newdict->LazilyCreateDict(&newdict->variable_dict_);
    for (VariableDict::const_iterator it = variable_dict_->begin();
         it != variable_dict_->end(); ++it) {
      newdict->variable_dict_->insert(make_pair(it->first,
                                                newdict->Memdup(it->second)));
    }
  }
  // ...and the template-global-dict, if we have one (only root-level tpls do)
  if (template_global_dict_) {
    newdict->template_global_dict_ = template_global_dict_->InternalMakeCopy(
        template_global_dict_->name(), newdict->arena_, newdict,
        newdict->template_global_dict_owner_);
  }
  // Copy the section dictionary
  if (section_dict_) {
    newdict->LazilyCreateDict(&newdict->section_dict_);
    for (SectionDict::iterator it = section_dict_->begin();
         it != section_dict_->end(); ++it) {
      DictVector* dicts = newdict->CreateDictVector();
      newdict->section_dict_->insert(make_pair(it->first, dicts));
      for (DictVector::iterator it2 = it->second->begin();
           it2 != it->second->end(); ++it2) {
        TemplateDictionary* subdict = *it2;
        // In this case, we pass in newdict as the parent of our new dict.
        dicts->push_back(subdict->InternalMakeCopy(
                             subdict->name(), newdict->arena_,
                             newdict, newdict->template_global_dict_owner_));
      }
    }
  }
  // Copy the includes-dictionary
  if (include_dict_) {
    newdict->LazilyCreateDict(&newdict->include_dict_);
    for (IncludeDict::iterator it = include_dict_->begin();
         it != include_dict_->end();  ++it) {
      DictVector* dicts = newdict->CreateDictVector();
      newdict->include_dict_->insert(make_pair(it->first, dicts));
      for (DictVector::iterator it2 = it->second->begin();
           it2 != it->second->end(); ++it2) {
        TemplateDictionary* subdict = *it2;
        // In this case, we pass in NULL as the parent of our new dict:
        // parents are not inherited across include-dictionaries.
        dicts->push_back(subdict->InternalMakeCopy(
                             subdict->name(), newdict->arena_,
                             NULL, newdict->template_global_dict_owner_));
      }
    }
  }

  // Finally, copy everything else not set properly by the constructor
  newdict->filename_ = newdict->Memdup(filename_).ptr_;

  return newdict;
}